

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,int dim,float coeff)

{
  bool bVar1;
  float *pfVar2;
  int in_EDX;
  Mat *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float in_XMM1_Da;
  int i_6;
  int i_5;
  float *ptr_4;
  int q_5;
  int j_3;
  int j_2;
  float *mins_ptr_1;
  int q_4;
  int j_1;
  int i_4;
  float *mins_ptr;
  float *ptr_3;
  int q_3;
  Mat mins;
  int j;
  float sum_3;
  int i_3;
  float *outptr;
  float *ptr_2;
  int q_2;
  int i_2;
  float sum_2;
  float *ptr_1;
  int q_1;
  int i_1;
  float sum;
  int i;
  float sum_1;
  float *ptr;
  int q;
  Mat sums;
  int size;
  int channels;
  int h;
  int w;
  plus<float> op2;
  plus<float> op;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  Mat *in_stack_fffffffffffffc80;
  Mat *this;
  Mat *in_stack_fffffffffffffc88;
  int _w;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  int local_2d8;
  int local_2d4;
  Mat local_2d0;
  Mat *local_2a0;
  int local_294;
  int local_290;
  int local_28c;
  Mat local_288;
  float *local_258;
  int local_24c;
  int local_248;
  int local_244;
  Mat local_240;
  float *local_210;
  Mat local_208;
  float *local_1d8;
  int local_1cc;
  int local_194;
  float local_190;
  int local_18c;
  Mat local_188;
  float *local_158;
  Mat local_150;
  float *local_120;
  int local_114;
  int local_110;
  float local_10c;
  Mat local_108;
  float *local_d8;
  int local_cc;
  int local_c8;
  float local_c4;
  int local_c0;
  float local_bc;
  Mat local_b8;
  float *local_88;
  int local_7c;
  int local_78;
  Mat local_68;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  plus<float> local_26;
  plus<float> local_25;
  float local_24;
  int local_20;
  float local_1c;
  Mat *local_18;
  int local_4;
  
  local_2c = *(int *)(in_RDI + 0x1c);
  local_30 = *(int *)(in_RDI + 0x20);
  local_34 = *(int *)(in_RDI + 0x24);
  local_38 = local_2c * local_30;
  _w = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
  local_24 = in_XMM1_Da;
  local_20 = in_EDX;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  if (in_EDX == 0) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),_w,
                (size_t)in_stack_fffffffffffffc80);
  }
  else if (in_EDX == 1) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),_w,
                (size_t)in_stack_fffffffffffffc80);
  }
  else if (in_EDX == 2) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),_w,
                (int)in_stack_fffffffffffffc88,(size_t)in_stack_fffffffffffffc80);
  }
  else if (in_EDX == -1) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),_w,
                (size_t)in_stack_fffffffffffffc80);
  }
  else if (in_EDX == -2) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),_w,
                (int)in_stack_fffffffffffffc88,(size_t)in_stack_fffffffffffffc80);
  }
  bVar1 = Mat::empty(in_stack_fffffffffffffc80);
  if (bVar1) {
    return -100;
  }
  if (local_20 == 0) {
    Mat::Mat(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,0x123c9f);
    bVar1 = Mat::empty(in_stack_fffffffffffffc80);
    if (bVar1) {
      local_4 = -100;
      local_78 = 1;
    }
    else {
      for (local_7c = 0; local_7c < local_34; local_7c = local_7c + 1) {
        Mat::channel(in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_b8);
        Mat::~Mat((Mat *)0x123d57);
        local_bc = local_1c;
        local_88 = pfVar2;
        for (local_c0 = 0; fVar3 = local_bc, local_c0 < local_38; local_c0 = local_c0 + 1) {
          local_bc = std::plus<float>::operator()(&local_25,&local_bc,local_88 + local_c0);
        }
        pfVar2 = Mat::operator[](&local_68,local_7c);
        *pfVar2 = fVar3;
      }
      local_c4 = local_1c;
      for (local_c8 = 0; local_c8 < local_34; local_c8 = local_c8 + 1) {
        pfVar2 = Mat::operator[](&local_68,local_c8);
        local_c4 = std::plus<float>::operator()(&local_26,&local_c4,pfVar2);
      }
      fVar3 = local_c4 * local_24;
      pfVar2 = Mat::operator[](local_18,0);
      *pfVar2 = fVar3;
      local_78 = 0;
    }
    Mat::~Mat((Mat *)0x123f34);
  }
  else {
    if (local_20 == 1) {
      for (local_cc = 0; local_cc < local_34; local_cc = local_cc + 1) {
        Mat::channel(in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_108);
        Mat::~Mat((Mat *)0x123fcc);
        local_10c = local_1c;
        local_d8 = pfVar2;
        for (local_110 = 0; local_110 < local_38; local_110 = local_110 + 1) {
          local_10c = std::plus<float>::operator()(&local_25,&local_10c,local_d8 + local_110);
        }
        fVar3 = local_10c * local_24;
        pfVar2 = Mat::operator[](local_18,local_cc);
        *pfVar2 = fVar3;
      }
      return 0;
    }
    if (local_20 == 2) {
      for (local_114 = 0; local_114 < local_34; local_114 = local_114 + 1) {
        Mat::channel(in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_150);
        Mat::~Mat((Mat *)0x124134);
        local_120 = pfVar2;
        Mat::channel(in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_188);
        Mat::~Mat((Mat *)0x124180);
        local_158 = pfVar2;
        for (local_18c = 0; local_18c < local_30; local_18c = local_18c + 1) {
          local_190 = local_1c;
          for (local_194 = 0; local_194 < local_2c; local_194 = local_194 + 1) {
            local_190 = std::plus<float>::operator()(&local_25,&local_190,local_120 + local_18c);
          }
          local_158[local_18c] = local_190 * local_24;
          local_120 = local_120 + local_2c;
        }
      }
      return 0;
    }
    fVar3 = (float)((ulong)in_stack_fffffffffffffc88 >> 0x20);
    if (local_20 != -1) {
      if (local_20 != -2) {
        return 0;
      }
      Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),fVar3);
      for (local_294 = 0; local_294 < local_34; local_294 = local_294 + 1) {
        this = &local_2d0;
        Mat::channel(in_stack_fffffffffffffc88,(int)((ulong)this >> 0x20));
        in_stack_fffffffffffffc88 = (Mat *)Mat::operator_cast_to_float_(this);
        Mat::~Mat((Mat *)0x1247fc);
        local_2a0 = in_stack_fffffffffffffc88;
        for (local_2d4 = 0; local_2d4 < local_38; local_2d4 = local_2d4 + 1) {
          pfVar2 = Mat::operator[](local_18,local_2d4);
          fVar3 = std::plus<float>::operator()
                            (&local_25,pfVar2,
                             (float *)((long)&local_2a0->data + (long)local_2d4 * 4));
          pfVar2 = Mat::operator[](local_18,local_2d4);
          *pfVar2 = fVar3;
        }
      }
      for (local_2d8 = 0; local_2d8 < local_38; local_2d8 = local_2d8 + 1) {
        fVar3 = local_24;
        pfVar2 = Mat::operator[](local_18,local_2d8);
        *pfVar2 = fVar3 * *pfVar2;
      }
      return 0;
    }
    Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),(int)fVar3,
             (int)in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20),
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    bVar1 = Mat::empty(in_stack_fffffffffffffc80);
    if (bVar1) {
      local_4 = -100;
      local_78 = 1;
    }
    else {
      Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                (float)((ulong)in_stack_fffffffffffffc88 >> 0x20));
      for (local_1cc = 0; local_1cc < local_34; local_1cc = local_1cc + 1) {
        Mat::channel(in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_208);
        Mat::~Mat((Mat *)0x1243e9);
        local_1d8 = pfVar2;
        Mat::channel(in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_240);
        Mat::~Mat((Mat *)0x124435);
        local_210 = pfVar2;
        for (local_244 = 0; local_244 < local_30; local_244 = local_244 + 1) {
          for (local_248 = 0; local_248 < local_2c; local_248 = local_248 + 1) {
            fVar3 = std::plus<float>::operator()
                              (&local_25,local_210 + local_248,local_1d8 + local_244);
            local_210[local_248] = fVar3;
          }
          local_1d8 = local_1d8 + local_2c;
        }
      }
      Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                (float)((ulong)in_stack_fffffffffffffc88 >> 0x20));
      for (local_24c = 0; local_24c < local_34; local_24c = local_24c + 1) {
        Mat::channel(in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_288);
        Mat::~Mat((Mat *)0x1245fc);
        local_258 = pfVar2;
        for (local_28c = 0; local_28c < local_2c; local_28c = local_28c + 1) {
          pfVar2 = Mat::operator[](local_18,local_28c);
          fVar3 = std::plus<float>::operator()(&local_26,pfVar2,local_258 + local_28c);
          pfVar2 = Mat::operator[](local_18,local_28c);
          *pfVar2 = fVar3;
        }
      }
      for (local_290 = 0; local_290 < local_2c; local_290 = local_290 + 1) {
        fVar3 = local_24;
        pfVar2 = Mat::operator[](local_18,local_290);
        *pfVar2 = fVar3 * *pfVar2;
      }
      local_78 = 0;
    }
    Mat::~Mat((Mat *)0x124751);
  }
  if (local_78 == 0) {
    return 0;
  }
  return local_4;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, int dim, float coeff)
{
    Op op;
    Op2 op2;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    if (dim == 0)
    {
        // w h c -> X X X
        b.create(1);
    }
    else if (dim == 1)
    {
        // w h c -> X X c
        b.create(channels);
    }
    else if (dim == 2)
    {
        // w h c -> X h c
        b.create(h, channels);
    }
    else if (dim == -1)
    {
        // w h c -> w X X
        b.create(w);
    }
    else if (dim == -2)
    {
        // w h c -> w h X
        b.create(w, h);
    }
    if (b.empty())
        return -100;

    if (dim == 0)
    {
        Mat sums(channels);
        if (sums.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            sums[q] = sum;
        }

        float sum = v0;
        for (int i=0; i<channels; i++)
        {
            sum = op2(sum, sums[i]);
        }

        b[0] = sum * coeff;
    }
    else if (dim == 1)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            b[q] = sum * coeff;
        }
    }
    else if (dim == 2)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = b.channel(q);

            for (int i=0; i<h; i++)
            {
                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[i] = sum * coeff;

                ptr += w;
            }
        }
    }
    else if (dim == -1)
    {
        Mat mins(w, 1, channels);
        if (mins.empty())
            return -100;

        mins.fill(v0);

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* mins_ptr = mins.channel(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    mins_ptr[j] = op(mins_ptr[j], ptr[i]);
                }

                ptr += w;
            }
        }

        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* mins_ptr = mins.channel(q);
            for (int j=0; j<w; j++)
            {
                b[j] = op2(b[j], mins_ptr[j]);
            }
        }

        for (int j=0; j<w; j++)
        {
            b[j] *= coeff;
        }
    }
    else if (dim == -2)
    {
        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            for (int i=0; i<size; i++)
            {
                b[i] = op(b[i], ptr[i]);
            }
        }

        for (int i=0; i<size; i++)
        {
            b[i] *= coeff;
        }
    }

    return 0;
}